

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O1

FT_UInt pcf_cmap_char_next(FT_CMap pcfcmap,FT_UInt32 *acharcode)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  FT_Face pFVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  pFVar4 = pcfcmap[1].charmap.face;
  uVar2 = *(ushort *)((long)&pFVar4->num_faces + 4);
  uVar6 = (*acharcode + 1 >> 8) - (uint)uVar2;
  uVar3 = (ushort)pFVar4->num_faces;
  uVar8 = (*acharcode + 1 & 0xff) - (uint)uVar3;
  uVar10 = (uint)*(ushort *)((long)&pFVar4->num_faces + 6) - (uint)uVar2;
  uVar1 = uVar10 + 1;
  uVar5 = 0;
  if ((int)uVar6 < 1) {
    uVar6 = uVar5;
  }
  if ((int)uVar8 < 1) {
    uVar8 = uVar5;
  }
  uVar9 = (ulong)uVar8;
  if (uVar6 < uVar1) {
    uVar7 = ((uint)*(ushort *)((long)&pFVar4->num_faces + 2) - (uint)uVar3) + 1;
    uVar11 = (ulong)(uVar6 * uVar7);
    uVar5 = 0;
    uVar8 = uVar6;
    do {
      if ((uint)uVar9 < uVar7) {
        do {
          uVar5 = (uint)*(ushort *)
                         (pFVar4->face_flags + (ulong)(uint)((int)uVar11 + (int)uVar9) * 2);
          uVar6 = uVar8;
          if (uVar5 != 0xffff) goto LAB_0022d4ee;
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        uVar5 = 0xffff;
      }
      uVar11 = uVar11 + uVar7;
      uVar9 = 0;
      bVar12 = uVar8 != uVar10;
      uVar6 = uVar1;
      uVar8 = uVar8 + 1;
    } while (bVar12);
  }
LAB_0022d4ee:
  *acharcode = (int)uVar9 + (uint)uVar3 | (uVar6 + uVar2) * 0x100;
  return uVar5;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pcf_cmap_char_next( FT_CMap    pcfcmap,   /* PCF_CMap */
                      FT_UInt32  *acharcode )
  {
    PCF_Enc    enc = ( (PCF_CMap)pcfcmap )->enc;
    FT_UInt32  charcode = *acharcode + 1;

    FT_UInt32  i = ( charcode >> 8   ) - enc->firstRow;
    FT_UInt32  j = ( charcode & 0xFF ) - enc->firstCol;
    FT_UInt32  h = enc->lastRow - enc->firstRow + 1;
    FT_UInt32  w = enc->lastCol - enc->firstCol + 1;

    FT_UInt  result = 0;


    /* adjust wrapped around "negative" values */
    if ( (FT_Int32)i < 0 )
      i = 0;
    if ( (FT_Int32)j < 0 )
      j = 0;

    for ( ; i < h; i++, j = 0 )
      for ( ; j < w; j++ )
      {
        result = (FT_UInt)enc->offset[i * w + j];
        if ( result != 0xFFFFU )
          goto Exit;
      }

  Exit:
    *acharcode = ( ( i + enc->firstRow ) << 8 ) | ( j + enc->firstCol );

    return result;
  }